

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPropertySet::~IfcPropertySet(IfcPropertySet *this)

{
  void *pvVar1;
  undefined1 *puVar2;
  
  this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot.Name.ptr.
  _M_string_length = (size_type)&PTR__IfcPropertySet_008e0788;
  *(undefined ***)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x28 =
       &PTR__IfcPropertySet_008e0828;
  *(undefined ***)&this[-1].field_0xc8 = &PTR__IfcPropertySet_008e07b0;
  *(undefined ***)&this[-1].field_0xd8 = &PTR__IfcPropertySet_008e07d8;
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPropertySet_008e0800;
  pvVar1 = *(void **)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.
                      super_IfcRoot.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot.Name.ptr.
  _M_string_length = 0x8e0a18;
  *(undefined8 *)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x28 =
       0x8e0a40;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.field_0xa0;
  if (puVar2 != &this[-1].super_IfcPropertySetDefinition.field_0xb0) {
    operator_delete(puVar2);
  }
  puVar2 = *(undefined1 **)
            ((long)&this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.
                    super_IfcRoot.Description.ptr.field_2 + 8);
  if (puVar2 != &this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot.
                 field_0x88) {
    operator_delete(puVar2);
  }
  puVar2 = *(undefined1 **)
            ((long)&this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.
                    super_IfcRoot.Name.ptr.field_2 + 8);
  if ((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      puVar2 != &this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot.
                 Description) {
    operator_delete(puVar2);
  }
  operator_delete(&this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot
                   .Name.ptr._M_string_length);
  return;
}

Assistant:

IfcPropertySet() : Object("IfcPropertySet") {}